

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O1

void ihevc_inter_pred_chroma_vert_w16inp
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short *psVar1;
  long lVar2;
  int iVar3;
  short *psVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  short *psVar8;
  ulong uVar9;
  
  if (0 < ht) {
    lVar2 = (long)src_strd;
    uVar5 = 1;
    if (1 < wd * 2) {
      uVar5 = (ulong)(uint)(wd * 2);
    }
    psVar1 = pi2_src + -lVar2;
    iVar3 = 0;
    do {
      if (0 < wd) {
        uVar9 = 0;
        psVar4 = psVar1;
        do {
          lVar7 = 0;
          iVar6 = 0;
          psVar8 = psVar4;
          do {
            iVar6 = iVar6 + (int)*psVar8 * (int)pi1_coeff[lVar7];
            lVar7 = lVar7 + 1;
            psVar8 = psVar8 + lVar2;
          } while (lVar7 != 4);
          iVar6 = (iVar6 >> 6) + 0x20 >> 6;
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          pu1_dst[uVar9] = (UWORD8)iVar6;
          uVar9 = uVar9 + 1;
          psVar4 = psVar4 + 1;
        } while (uVar9 != uVar5);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar3 = iVar3 + 1;
      psVar1 = psVar1 + lVar2;
    } while (iVar3 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp(WORD16 *pi2_src,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 1) * src_strd];
            }

            i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i4_tmp = CLIP_U8(i4_tmp);

            pu1_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pu1_dst += dst_strd;
    }

}